

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratBig.cpp
# Opt level: O0

void __thiscall
primesieve::EratBig::storeSievingPrime
          (EratBig *this,uint64_t prime,uint64_t multipleIndex,uint64_t wheelIndex)

{
  undefined8 uVar1;
  ulong uVar2;
  SievingPrime *this_00;
  bool bVar3;
  Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *sievingPrime_00;
  uint64_t uVar4;
  MemoryPool *this_01;
  size_t sVar5;
  SievingPrime **ppSVar6;
  size_t in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint64_t segment;
  uint64_t newSize;
  uint64_t maxSegmentIndex;
  uint64_t maxMultipleIndex;
  uint64_t maxNextMultiple;
  uint64_t sievingPrime;
  uint64_t sieveSize;
  undefined8 local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  size_t n;
  Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *this_02;
  unsigned_long local_20 [2];
  undefined8 *local_10;
  Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *local_8;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x18);
  sievingPrime_00 =
       (Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *)
       (in_RSI / 0x1e);
  this_02 = sievingPrime_00;
  uVar4 = Wheel<210,_48,_10,_primesieve::wheel210Init>::getMaxFactor();
  this_01 = (MemoryPool *)((long)sievingPrime_00 * uVar4);
  uVar4 = Wheel<210,_48,_10,_primesieve::wheel210Init>::getMaxFactor();
  n = (long)&this_01->stock_ + uVar4;
  local_60 = (1L << ((byte)uVar1 & 0x3f)) + -1 + n;
  local_68 = local_60 >> ((byte)*(undefined8 *)(in_RDI + 0x18) & 0x3f);
  local_70 = local_68 + 1;
  local_78 = in_RDX >> ((byte)*(undefined8 *)(in_RDI + 0x18) & 0x3f);
  uVar2 = *(ulong *)(in_RDI + 0x20);
  while (sVar5 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
                 size((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                       *)(in_RDI + 0x30)), sVar5 < local_70) {
    local_8 = (Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *)
              (in_RDI + 0x30);
    local_80 = 0;
    local_10 = &local_80;
    if (*(long *)(in_RDI + 0x38) == *(long *)(in_RDI + 0x40)) {
      local_20[1] = 1;
      sVar5 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
              capacity(local_8);
      local_20[0] = sVar5 << 1;
      std::max<unsigned_long>(local_20 + 1,local_20);
      Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
      reserve_unchecked(this_02,n);
    }
    **(undefined8 **)(in_RDI + 0x38) = *local_10;
    *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 8;
  }
  ppSVar6 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
            operator[]((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                        *)(in_RDI + 0x30),local_78);
  bVar3 = Bucket::isFull(*ppSVar6);
  if (bVar3) {
    Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::operator[]
              ((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *)
               (in_RDI + 0x30),local_78);
    MemoryPool::addBucket(this_01,(SievingPrime **)sievingPrime_00);
  }
  ppSVar6 = Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
            operator[]((Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                        *)(in_RDI + 0x30),local_78);
  this_00 = *ppSVar6;
  *ppSVar6 = this_00 + 1;
  SievingPrime::set(this_00,(size_t)this_02,uVar2 & in_RDX,in_RCX);
  return;
}

Assistant:

void EratBig::storeSievingPrime(uint64_t prime,
                                uint64_t multipleIndex,
                                uint64_t wheelIndex)
{
  uint64_t sieveSize = 1ull << log2SieveSize_;
  uint64_t sievingPrime = prime / 30;
  uint64_t maxNextMultiple = sievingPrime * getMaxFactor() + getMaxFactor();
  uint64_t maxMultipleIndex = sieveSize - 1 + maxNextMultiple;
  uint64_t maxSegmentIndex = maxMultipleIndex >> log2SieveSize_;
  uint64_t newSize = maxSegmentIndex + 1;
  uint64_t segment = multipleIndex >> log2SieveSize_;
  multipleIndex &= moduloSieveSize_;

  while (buckets_.size() < newSize)
    buckets_.push_back(nullptr);

  ASSERT(prime <= maxPrime_);
  ASSERT(segment < buckets_.size());

  if (Bucket::isFull(buckets_[segment]))
    memoryPool_->addBucket(buckets_[segment]);

  buckets_[segment]++->set(sievingPrime, multipleIndex, wheelIndex);
}